

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QList<int> * __thiscall
QDockAreaLayout::findSeparator(QList<int> *__return_storage_ptr__,QDockAreaLayout *this,QPoint *pos)

{
  Representation RVar1;
  int *piVar2;
  bool bVar3;
  char cVar4;
  Representation RVar5;
  ulong uVar6;
  QDockAreaLayoutInfo *this_00;
  Representation RVar7;
  long lVar8;
  int index;
  long lVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_60;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar9 = 0;
  do {
    this_00 = this->docks + lVar9;
    uVar6 = 0xffffffffffffffff;
    lVar8 = 0;
    do {
      uVar6 = uVar6 + 1;
      if ((ulong)(this_00->item_list).d.size <= uVar6) goto LAB_003f5d61;
      bVar3 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&((this_00->item_list).d.ptr)->widgetItem + lVar8));
      lVar8 = lVar8 + 0x28;
    } while (bVar3);
    stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    index = (int)lVar9;
    _local_48 = separatorRect(this,index);
    RVar1 = local_48._0_4_;
    RVar5 = local_48._8_4_;
    RVar7 = local_48._12_4_;
    if ((local_48._4_4_.m_i + -1 != RVar7.m_i || RVar1.m_i + -1 != RVar5.m_i) && (this->sep == 1)) {
      local_48._4_4_ = local_48._4_4_.m_i + -2;
      local_48._0_4_ = RVar1.m_i + -2;
      local_48._8_4_ = RVar5.m_i + 2;
      RStack_3c.m_i = RVar7.m_i + 2;
    }
    cVar4 = QRect::contains((QPoint *)local_48,SUB81(pos,0));
    if (cVar4 != '\0') {
      bVar3 = QDockAreaLayoutInfo::hasFixedSize(this_00);
      if (!bVar3) {
        local_60.d._0_4_ = index;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                   (int *)&local_60);
        QList<int>::end(__return_storage_ptr__);
        break;
      }
    }
    cVar4 = QRect::contains((QPoint *)&this_00->rect,SUB81(pos,0));
    if (cVar4 != '\0') {
      QDockAreaLayoutInfo::findSeparator((QList<int> *)&local_60,this_00,pos);
      QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_60);
      piVar2 = (int *)CONCAT44(local_60.d._4_4_,(int)local_60.d);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_60.d._4_4_,(int)local_60.d),4,0x10);
        }
      }
      if ((__return_storage_ptr__->d).size != 0) {
        local_60.d._0_4_ = index;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)__return_storage_ptr__,0,(int *)&local_60);
        break;
      }
    }
LAB_003f5d61:
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayout::findSeparator(const QPoint &pos) const
{
    QList<int> result;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];
        if (info.isEmpty())
            continue;
        QRect rect = separatorRect(i);
        if (!rect.isNull() && sep == 1)
            rect.adjust(-2, -2, 2, 2);
        if (rect.contains(pos) && !info.hasFixedSize()) {
            result << i;
            break;
        } else if (info.rect.contains(pos)) {
            result = docks[i].findSeparator(pos);
            if (!result.isEmpty()) {
                result.prepend(i);
                break;
            }
        }
    }

    return result;
}